

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

int __thiscall pbrt::TriangleMesh::writeTo(TriangleMesh *this,BinaryWriter *binary)

{
  Shape::writeTo(&this->super_Shape,binary);
  BinaryWriter::write<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>,void>
            (binary,&this->vertex);
  BinaryWriter::write<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>,void>
            (binary,&this->normal);
  BinaryWriter::write<pbrt::math::vec2f,std::allocator<pbrt::math::vec2f>,void>
            (binary,&this->texcoord);
  BinaryWriter::write<pbrt::math::vec3i,std::allocator<pbrt::math::vec3i>,void>(binary,&this->index)
  ;
  return 0x32;
}

Assistant:

int TriangleMesh::writeTo(BinaryWriter &binary) 
  {
    Shape::writeTo(binary);
    binary.write(vertex);
    binary.write(normal);
    binary.write(texcoord);
    binary.write(index);
    return TYPE_TRIANGLE_MESH;
  }